

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::StepFile::StepFileImporter::InternReadFile
          (StepFileImporter *this,string *file,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  IOStream *__p;
  element_type *peVar2;
  DeadlyImportError *this_00;
  DB *__p_00;
  type this_01;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  DeadlyImportError local_b8;
  HeaderInfo *local_a8;
  HeaderInfo *head;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> local_90;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> db;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  shared_ptr<Assimp::IOStream> fileStream;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *file_local;
  StepFileImporter *this_local;
  
  fileStream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIOHandler;
  __p = IOSystem::Open(pIOHandler,file,(string *)mode_abi_cxx11_);
  std::shared_ptr<Assimp::IOStream>::shared_ptr<Assimp::IOStream,void>
            ((shared_ptr<Assimp::IOStream> *)local_38,__p);
  peVar2 = std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  if (peVar2 != (element_type *)0x0) {
    std::shared_ptr<Assimp::IOStream>::shared_ptr
              ((shared_ptr<Assimp::IOStream> *)&head,(shared_ptr<Assimp::IOStream> *)local_38);
    __p_00 = STEP::ReadFileHeader((shared_ptr<Assimp::IOStream> *)&head);
    std::unique_ptr<Assimp::STEP::DB,std::default_delete<Assimp::STEP::DB>>::
    unique_ptr<std::default_delete<Assimp::STEP::DB>,void>
              ((unique_ptr<Assimp::STEP::DB,std::default_delete<Assimp::STEP::DB>> *)&local_90,
               __p_00);
    std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)&head);
    this_01 = std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::operator*
                        (&local_90);
    local_a8 = STEP::DB::GetHeader(this_01);
    lVar3 = std::__cxx11::string::size();
    if ((lVar3 == 0) ||
       (bVar1 = std::operator!=(&local_a8->fileSchema,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )StepFileSchema_abi_cxx11_), bVar1)) {
      std::operator+(&local_d8,"Unrecognized file schema: ",&local_a8->fileSchema);
      DeadlyImportError::DeadlyImportError(&local_b8,&local_d8);
      DeadlyImportError::~DeadlyImportError(&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::~unique_ptr
              (&local_90);
    std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)local_38);
    return;
  }
  db._M_t.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
  super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl._3_1_ = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_78,"Failed to open file ",file);
  std::operator+(&local_58,&local_78,".");
  DeadlyImportError::DeadlyImportError(this_00,&local_58);
  db._M_t.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
  super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl._3_1_ = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void StepFileImporter::InternReadFile(const std::string &file, aiScene* pScene, IOSystem* pIOHandler) {
    // Read file into memory
    std::shared_ptr<IOStream> fileStream(pIOHandler->Open(file, mode));
    if (!fileStream.get()) {
        throw DeadlyImportError("Failed to open file " + file + ".");
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(fileStream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();
    if (!head.fileSchema.size() || head.fileSchema != StepFileSchema) {
        DeadlyImportError("Unrecognized file schema: " + head.fileSchema);
    }
}